

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
IntrusiveListTest_splice_list_Test::TestBody(IntrusiveListTest_splice_list_Test *this)

{
  vector<int,_std::allocator<int>_> *data_values;
  vector<int,_std::allocator<int>_> *data_values_00;
  vector<int,_std::allocator<int>_> *expected;
  vector<int,_std::allocator<int>_> *expected_00;
  vector<int,_std::allocator<int>_> *data_values_01;
  vector<int,_std::allocator<int>_> *expected_01;
  vector<int,_std::allocator<int>_> *expected_02;
  vector<int,_std::allocator<int>_> *data_values_02;
  vector<int,_std::allocator<int>_> *expected_03;
  vector<int,_std::allocator<int>_> *expected_04;
  int __fdin;
  __off64_t *in_R8;
  size_t in_R9;
  iterator iVar1;
  uint uVar2;
  undefined4 local_c8;
  undefined1 local_c4 [12];
  TestObjectList list3;
  TestObjectList list4;
  TestObjectList list2;
  TestObjectList local_68;
  TestObjectList list1;
  
  list2.first_ = (TestObject *)0x200000001;
  list2.last_._0_4_ = 3;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&stack0xffffffffffffff18,&list2);
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::NewList
            (&list1,(IntrusiveListTest *)&stack0xffffffffffffff18,data_values);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&stack0xffffffffffffff18);
  list3.first_ = (TestObject *)0xc800000064;
  uVar2 = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&stack0xffffffffffffff18,&list3);
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::NewList
            (&list2,(IntrusiveListTest *)&stack0xffffffffffffff18,data_values_00);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&stack0xffffffffffffff18);
  __fdin = (int)&list1;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&list1,__fdin,(__off64_t *)list1.first_,(int)&list2,in_R8,in_R9,uVar2);
  list3.first_ = (TestObject *)0xc800000064;
  list3.last_ = (TestObject *)0x200000001;
  list3.size_._0_4_ = 3;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&stack0xffffffffffffff18,&list3,
             (undefined1 *)((long)&list3.size_ + 4));
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list1,(TestObjectList *)&stack0xffffffffffffff18,expected);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&stack0xffffffffffffff18);
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list2,(TestObjectList *)&stack0xffffffffffffff18,expected_00);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&stack0xffffffffffffff18);
  list4.first_ = (TestObject *)0x258000001f4;
  list4.last_ = (TestObject *)CONCAT44(list4.last_._4_4_,700);
  uVar2 = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&stack0xffffffffffffff18,&list4);
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::NewList
            (&list3,(IntrusiveListTest *)&stack0xffffffffffffff18,data_values_01);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&stack0xffffffffffffff18);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&list1,__fdin,(__off64_t *)0x0,(int)&list3,in_R8,in_R9,uVar2);
  list4.first_ = (TestObject *)0x0;
  list4.last_ = (TestObject *)0x0;
  list4.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&list4,&stack0xffffffffffffff18,&local_c8);
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list1,&list4,expected_01);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&list4);
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list3,(TestObjectList *)&stack0xffffffffffffff18,expected_02);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&stack0xffffffffffffff18);
  local_68.first_ = (TestObject *)CONCAT44(local_68.first_._4_4_,400);
  uVar2 = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&stack0xffffffffffffff18,&local_68);
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::NewList
            (&list4,(IntrusiveListTest *)&stack0xffffffffffffff18,data_values_02);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&stack0xffffffffffffff18);
  iVar1.node_ = list1.first_;
  iVar1.list_ = &list1;
  iVar1 = std::next<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>(iVar1,4);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&list1,(int)iVar1.list_,(__off64_t *)iVar1.node_,(int)&list4,in_R8,in_R9,uVar2);
  local_c8 = 700;
  local_68.first_ = (TestObject *)0x0;
  local_68.last_ = (TestObject *)0x0;
  local_68.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_68,&stack0xffffffffffffff18,local_c4);
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list1,&local_68,expected_03);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_68);
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list4,(TestObjectList *)&stack0xffffffffffffff18,expected_04);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&stack0xffffffffffffff18);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&list4);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&list3);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&list2);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&list1);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, splice_list) {
  TestObjectList list1 = NewList({1, 2, 3});

  // Splice at beginning.
  TestObjectList list2 = NewList({100, 200});
  list1.splice(list1.begin(), list2);
  AssertListEq(list1, {100, 200, 1, 2, 3});
  AssertListEq(list2, {});

  // Splice at end.
  TestObjectList list3 = NewList({500, 600, 700});
  list1.splice(list1.end(), list3);
  AssertListEq(list1, {100, 200, 1, 2, 3, 500, 600, 700});
  AssertListEq(list3, {});

  // Splice in the middle.
  TestObjectList list4 = NewList({400});
  list1.splice(std::next(list1.begin(), 4), list4);
  AssertListEq(list1, {100, 200, 1, 2, 400, 3, 500, 600, 700});
  AssertListEq(list4, {});
}